

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conv2d-dw.cpp
# Opt level: O1

vector<float,_std::allocator<float>_> *
f32_range(vector<float,_std::allocator<float>_> *__return_storage_ptr__,int n,float start,float end)

{
  pointer pfVar1;
  undefined1 auVar2 [16];
  long lVar3;
  int iVar5;
  undefined1 auVar4 [16];
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  float fVar13;
  undefined1 auVar14 [16];
  int iVar15;
  allocator_type local_39;
  float local_38;
  float local_28;
  long lVar7;
  
  local_38 = start;
  local_28 = end;
  std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__,(long)n,&local_39);
  auVar2 = _DAT_00103040;
  if (0 < n) {
    fVar13 = (local_28 - local_38) / (float)n;
    pfVar1 = (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar3 = (ulong)(uint)n - 1;
    auVar4._8_4_ = (int)lVar3;
    auVar4._0_8_ = lVar3;
    auVar4._12_4_ = (int)((ulong)lVar3 >> 0x20);
    uVar9 = 0;
    uVar10 = 1;
    uVar11 = 2;
    uVar12 = 3;
    lVar3 = 0;
    auVar4 = auVar4 ^ _DAT_00103040;
    auVar6 = _DAT_00103010;
    auVar8 = _DAT_00103020;
    do {
      auVar14 = auVar8 ^ auVar2;
      iVar5 = auVar4._4_4_;
      if ((bool)(~(auVar14._4_4_ == iVar5 && auVar4._0_4_ < auVar14._0_4_ || iVar5 < auVar14._4_4_)
                & 1)) {
        *(float *)((long)pfVar1 + lVar3) =
             (((float)(uVar9 >> 0x10 | 0x53000000) - 5.497642e+11) +
             (float)(uVar9 & 0xffff | 0x4b000000)) * fVar13 + local_38;
      }
      if ((auVar14._12_4_ != auVar4._12_4_ || auVar14._8_4_ <= auVar4._8_4_) &&
          auVar14._12_4_ <= auVar4._12_4_) {
        *(float *)((long)pfVar1 + lVar3 + 4) =
             (((float)(uVar10 >> 0x10 | 0x53000000) - 5.497642e+11) +
             (float)(uVar10 & 0xffff | 0x4b000000)) * fVar13 + local_38;
      }
      auVar14 = auVar6 ^ auVar2;
      iVar15 = auVar14._4_4_;
      if (iVar15 <= iVar5 && (iVar15 != iVar5 || auVar14._0_4_ <= auVar4._0_4_)) {
        *(float *)((long)pfVar1 + lVar3 + 8) =
             (((float)(uVar11 >> 0x10 | 0x53000000) - 5.497642e+11) +
             (float)(uVar11 & 0xffff | 0x4b000000)) * fVar13 + local_38;
        *(float *)((long)pfVar1 + lVar3 + 0xc) =
             (((float)(uVar12 >> 0x10 | 0x53000000) - 5.497642e+11) +
             (float)(uVar12 & 0xffff | 0x4b000000)) * fVar13 + local_38;
      }
      lVar7 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 4;
      auVar8._8_8_ = lVar7 + 4;
      lVar7 = auVar6._8_8_;
      auVar6._0_8_ = auVar6._0_8_ + 4;
      auVar6._8_8_ = lVar7 + 4;
      uVar9 = uVar9 + 4;
      uVar10 = uVar10 + 4;
      uVar11 = uVar11 + 4;
      uVar12 = uVar12 + 4;
      lVar3 = lVar3 + 0x10;
    } while ((ulong)(n + 3U >> 2) << 4 != lVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<float> f32_range(int n, float start, float end) {
    std::vector<float> values(n);
    float step = (end - start) / n;
    for (int i = 0; i < n; i++) {
        values[i] = start + i * step;
    }
    return values;
}